

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  long *in_RSI;
  long in_RDI;
  SimpleString argument;
  int i;
  bool correctParameters;
  SimpleString *in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde1;
  byte in_stack_fffffffffffffde2;
  byte in_stack_fffffffffffffde3;
  undefined1 in_stack_fffffffffffffde4;
  byte in_stack_fffffffffffffde5;
  byte in_stack_fffffffffffffde6;
  byte in_stack_fffffffffffffde7;
  byte in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf1;
  byte in_stack_fffffffffffffdf2;
  byte in_stack_fffffffffffffdf3;
  byte in_stack_fffffffffffffdf4;
  int *in_stack_fffffffffffffe18;
  char **in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe2c;
  CommandLineArguments *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  char **in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  CommandLineArguments *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe80;
  char **in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  CommandLineArguments *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffea8;
  char **in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  CommandLineArguments *in_stack_fffffffffffffec0;
  char **in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  CommandLineArguments *in_stack_fffffffffffffed8;
  int local_20;
  bool local_19;
  byte local_1;
  
  local_19 = true;
  for (local_20 = 1; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
    SimpleString::SimpleString
              ((SimpleString *)
               CONCAT17(in_stack_fffffffffffffde7,
                        CONCAT16(in_stack_fffffffffffffde6,
                                 CONCAT15(in_stack_fffffffffffffde5,
                                          CONCAT14(in_stack_fffffffffffffde4,
                                                   CONCAT13(in_stack_fffffffffffffde3,
                                                            CONCAT12(in_stack_fffffffffffffde2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
               (char *)in_stack_fffffffffffffdd8);
    SimpleString::SimpleString
              ((SimpleString *)
               CONCAT17(in_stack_fffffffffffffde7,
                        CONCAT16(in_stack_fffffffffffffde6,
                                 CONCAT15(in_stack_fffffffffffffde5,
                                          CONCAT14(in_stack_fffffffffffffde4,
                                                   CONCAT13(in_stack_fffffffffffffde3,
                                                            CONCAT12(in_stack_fffffffffffffde2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
               (char *)in_stack_fffffffffffffdd8);
    bVar1 = operator==((SimpleString *)
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT15(in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                       in_stack_fffffffffffffdd8);
    SimpleString::~SimpleString((SimpleString *)0x122ccc);
    if ((bVar1 & 1) == 0) {
      SimpleString::SimpleString
                ((SimpleString *)
                 CONCAT17(in_stack_fffffffffffffde7,
                          CONCAT16(in_stack_fffffffffffffde6,
                                   CONCAT15(in_stack_fffffffffffffde5,
                                            CONCAT14(in_stack_fffffffffffffde4,
                                                     CONCAT13(in_stack_fffffffffffffde3,
                                                              CONCAT12(in_stack_fffffffffffffde2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                 (char *)in_stack_fffffffffffffdd8);
      bVar2 = operator==((SimpleString *)
                         CONCAT17(in_stack_fffffffffffffde7,
                                  CONCAT16(in_stack_fffffffffffffde6,
                                           CONCAT15(in_stack_fffffffffffffde5,
                                                    CONCAT14(in_stack_fffffffffffffde4,
                                                             CONCAT13(in_stack_fffffffffffffde3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                         in_stack_fffffffffffffdd8);
      SimpleString::~SimpleString((SimpleString *)0x122d69);
      if ((bVar2 & 1) == 0) {
        SimpleString::SimpleString
                  ((SimpleString *)
                   CONCAT17(in_stack_fffffffffffffde7,
                            CONCAT16(in_stack_fffffffffffffde6,
                                     CONCAT15(in_stack_fffffffffffffde5,
                                              CONCAT14(in_stack_fffffffffffffde4,
                                                       CONCAT13(in_stack_fffffffffffffde3,
                                                                CONCAT12(in_stack_fffffffffffffde2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                   (char *)in_stack_fffffffffffffdd8);
        bVar3 = operator==((SimpleString *)
                           CONCAT17(in_stack_fffffffffffffde7,
                                    CONCAT16(in_stack_fffffffffffffde6,
                                             CONCAT15(in_stack_fffffffffffffde5,
                                                      CONCAT14(in_stack_fffffffffffffde4,
                                                               CONCAT13(in_stack_fffffffffffffde3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                           in_stack_fffffffffffffdd8);
        SimpleString::~SimpleString((SimpleString *)0x122de5);
        if ((bVar3 & 1) == 0) {
          SimpleString::SimpleString
                    ((SimpleString *)
                     CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,
                                       CONCAT15(in_stack_fffffffffffffde5,
                                                CONCAT14(in_stack_fffffffffffffde4,
                                                         CONCAT13(in_stack_fffffffffffffde3,
                                                                  CONCAT12(in_stack_fffffffffffffde2
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                     (char *)in_stack_fffffffffffffdd8);
          bVar4 = operator==((SimpleString *)
                             CONCAT17(in_stack_fffffffffffffde7,
                                      CONCAT16(in_stack_fffffffffffffde6,
                                               CONCAT15(in_stack_fffffffffffffde5,
                                                        CONCAT14(in_stack_fffffffffffffde4,
                                                                 CONCAT13(in_stack_fffffffffffffde3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                             in_stack_fffffffffffffdd8);
          SimpleString::~SimpleString((SimpleString *)0x122e61);
          if ((bVar4 & 1) == 0) {
            SimpleString::SimpleString
                      ((SimpleString *)
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT15(in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                       (char *)in_stack_fffffffffffffdd8);
            bVar5 = operator==((SimpleString *)
                               CONCAT17(in_stack_fffffffffffffde7,
                                        CONCAT16(in_stack_fffffffffffffde6,
                                                 CONCAT15(in_stack_fffffffffffffde5,
                                                          CONCAT14(in_stack_fffffffffffffde4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                               ,in_stack_fffffffffffffdd8);
            SimpleString::~SimpleString((SimpleString *)0x122edd);
            if ((bVar5 & 1) == 0) {
              SimpleString::SimpleString
                        ((SimpleString *)
                         CONCAT17(in_stack_fffffffffffffde7,
                                  CONCAT16(in_stack_fffffffffffffde6,
                                           CONCAT15(in_stack_fffffffffffffde5,
                                                    CONCAT14(in_stack_fffffffffffffde4,
                                                             CONCAT13(in_stack_fffffffffffffde3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                         (char *)in_stack_fffffffffffffdd8);
              bVar6 = operator==((SimpleString *)
                                 CONCAT17(in_stack_fffffffffffffde7,
                                          CONCAT16(in_stack_fffffffffffffde6,
                                                   CONCAT15(in_stack_fffffffffffffde5,
                                                            CONCAT14(in_stack_fffffffffffffde4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                 ,in_stack_fffffffffffffdd8);
              SimpleString::~SimpleString((SimpleString *)0x122f59);
              if ((bVar6 & 1) == 0) {
                SimpleString::SimpleString
                          ((SimpleString *)
                           CONCAT17(in_stack_fffffffffffffde7,
                                    CONCAT16(in_stack_fffffffffffffde6,
                                             CONCAT15(in_stack_fffffffffffffde5,
                                                      CONCAT14(in_stack_fffffffffffffde4,
                                                               CONCAT13(in_stack_fffffffffffffde3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                           (char *)in_stack_fffffffffffffdd8);
                bVar7 = operator==((SimpleString *)
                                   CONCAT17(in_stack_fffffffffffffde7,
                                            CONCAT16(in_stack_fffffffffffffde6,
                                                     CONCAT15(in_stack_fffffffffffffde5,
                                                              CONCAT14(in_stack_fffffffffffffde4,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                   ,in_stack_fffffffffffffdd8);
                SimpleString::~SimpleString((SimpleString *)0x122fd5);
                if ((bVar7 & 1) == 0) {
                  SimpleString::SimpleString
                            ((SimpleString *)
                             CONCAT17(in_stack_fffffffffffffde7,
                                      CONCAT16(in_stack_fffffffffffffde6,
                                               CONCAT15(in_stack_fffffffffffffde5,
                                                        CONCAT14(in_stack_fffffffffffffde4,
                                                                 CONCAT13(in_stack_fffffffffffffde3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                             (char *)in_stack_fffffffffffffdd8);
                  bVar8 = operator==((SimpleString *)
                                     CONCAT17(in_stack_fffffffffffffde7,
                                              CONCAT16(in_stack_fffffffffffffde6,
                                                       CONCAT15(in_stack_fffffffffffffde5,
                                                                CONCAT14(in_stack_fffffffffffffde4,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                     ,in_stack_fffffffffffffdd8);
                  SimpleString::~SimpleString((SimpleString *)0x123051);
                  if ((bVar8 & 1) == 0) {
                    SimpleString::SimpleString
                              ((SimpleString *)
                               CONCAT17(in_stack_fffffffffffffde7,
                                        CONCAT16(in_stack_fffffffffffffde6,
                                                 CONCAT15(in_stack_fffffffffffffde5,
                                                          CONCAT14(in_stack_fffffffffffffde4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                               ,(char *)in_stack_fffffffffffffdd8);
                    bVar9 = operator==((SimpleString *)
                                       CONCAT17(in_stack_fffffffffffffde7,
                                                CONCAT16(in_stack_fffffffffffffde6,
                                                         CONCAT15(in_stack_fffffffffffffde5,
                                                                  CONCAT14(in_stack_fffffffffffffde4
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                       ,in_stack_fffffffffffffdd8);
                    SimpleString::~SimpleString((SimpleString *)0x1230cd);
                    if ((bVar9 & 1) == 0) {
                      SimpleString::SimpleString
                                ((SimpleString *)
                                 CONCAT17(in_stack_fffffffffffffde7,
                                          CONCAT16(in_stack_fffffffffffffde6,
                                                   CONCAT15(in_stack_fffffffffffffde5,
                                                            CONCAT14(in_stack_fffffffffffffde4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                 ,(char *)in_stack_fffffffffffffdd8);
                      bVar10 = operator==((SimpleString *)
                                          CONCAT17(in_stack_fffffffffffffde7,
                                                   CONCAT16(in_stack_fffffffffffffde6,
                                                            CONCAT15(in_stack_fffffffffffffde5,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                                          in_stack_fffffffffffffdd8);
                      SimpleString::~SimpleString((SimpleString *)0x123149);
                      if ((bVar10 & 1) == 0) {
                        SimpleString::SimpleString
                                  ((SimpleString *)
                                   CONCAT17(in_stack_fffffffffffffde7,
                                            CONCAT16(in_stack_fffffffffffffde6,
                                                     CONCAT15(in_stack_fffffffffffffde5,
                                                              CONCAT14(in_stack_fffffffffffffde4,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                   ,(char *)in_stack_fffffffffffffdd8);
                        bVar11 = operator==((SimpleString *)
                                            CONCAT17(in_stack_fffffffffffffde7,
                                                     CONCAT16(in_stack_fffffffffffffde6,
                                                              CONCAT15(in_stack_fffffffffffffde5,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                                            in_stack_fffffffffffffdd8);
                        SimpleString::~SimpleString((SimpleString *)0x1231c5);
                        if ((bVar11 & 1) == 0) {
                          SimpleString::SimpleString
                                    ((SimpleString *)
                                     CONCAT17(in_stack_fffffffffffffde7,
                                              CONCAT16(in_stack_fffffffffffffde6,
                                                       CONCAT15(in_stack_fffffffffffffde5,
                                                                CONCAT14(in_stack_fffffffffffffde4,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                     ,(char *)in_stack_fffffffffffffdd8);
                          in_stack_fffffffffffffdf4 =
                               SimpleString::startsWith
                                         ((SimpleString *)
                                          CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  bVar4,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7
                                                  ,bVar8))))))),
                                          (SimpleString *)
                                          CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,CONCAT14(
                                                  in_stack_fffffffffffffdf4,
                                                  CONCAT13(in_stack_fffffffffffffdf3,
                                                           CONCAT12(in_stack_fffffffffffffdf2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffdf1,
                                                  in_stack_fffffffffffffdf0))))))));
                          SimpleString::~SimpleString((SimpleString *)0x123241);
                          if ((in_stack_fffffffffffffdf4 & 1) == 0) {
                            SimpleString::SimpleString
                                      ((SimpleString *)
                                       CONCAT17(in_stack_fffffffffffffde7,
                                                CONCAT16(in_stack_fffffffffffffde6,
                                                         CONCAT15(in_stack_fffffffffffffde5,
                                                                  CONCAT14(in_stack_fffffffffffffde4
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                       ,(char *)in_stack_fffffffffffffdd8);
                            in_stack_fffffffffffffdf3 =
                                 SimpleString::startsWith
                                           ((SimpleString *)
                                            CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  bVar4,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7
                                                  ,bVar8))))))),
                                            (SimpleString *)
                                            CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,CONCAT14(
                                                  in_stack_fffffffffffffdf4,
                                                  CONCAT13(in_stack_fffffffffffffdf3,
                                                           CONCAT12(in_stack_fffffffffffffdf2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffdf1,
                                                  in_stack_fffffffffffffdf0))))))));
                            SimpleString::~SimpleString((SimpleString *)0x1232cf);
                            if ((in_stack_fffffffffffffdf3 & 1) == 0) {
                              SimpleString::SimpleString
                                        ((SimpleString *)
                                         CONCAT17(in_stack_fffffffffffffde7,
                                                  CONCAT16(in_stack_fffffffffffffde6,
                                                           CONCAT15(in_stack_fffffffffffffde5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                                         (char *)in_stack_fffffffffffffdd8);
                              in_stack_fffffffffffffdf2 =
                                   SimpleString::startsWith
                                             ((SimpleString *)
                                              CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  bVar4,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7
                                                  ,bVar8))))))),
                                              (SimpleString *)
                                              CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                              SimpleString::~SimpleString((SimpleString *)0x12335d);
                              if ((in_stack_fffffffffffffdf2 & 1) == 0) {
                                SimpleString::SimpleString
                                          ((SimpleString *)
                                           CONCAT17(in_stack_fffffffffffffde7,
                                                    CONCAT16(in_stack_fffffffffffffde6,
                                                             CONCAT15(in_stack_fffffffffffffde5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                                           (char *)in_stack_fffffffffffffdd8);
                                in_stack_fffffffffffffdf0 =
                                     SimpleString::startsWith
                                               ((SimpleString *)
                                                CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,
                                                  CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6,
                                                  CONCAT11(bVar7,bVar8))))))),
                                                (SimpleString *)
                                                CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                SimpleString::~SimpleString((SimpleString *)0x1233fc);
                                if ((in_stack_fffffffffffffdf0 & 1) == 0) {
                                  SimpleString::SimpleString
                                            ((SimpleString *)
                                             CONCAT17(in_stack_fffffffffffffde7,
                                                      CONCAT16(in_stack_fffffffffffffde6,
                                                               CONCAT15(in_stack_fffffffffffffde5,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                                             (char *)in_stack_fffffffffffffdd8);
                                  bVar12 = SimpleString::startsWith
                                                     ((SimpleString *)
                                                      CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,
                                                  CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6,
                                                  CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                  SimpleString::~SimpleString((SimpleString *)0x12348a);
                                  if (bVar12) {
                                    addExcludeGroupFilter
                                              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                                               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                                  }
                                  else {
                                    SimpleString::SimpleString
                                              ((SimpleString *)
                                               CONCAT17(in_stack_fffffffffffffde7,
                                                        CONCAT16(in_stack_fffffffffffffde6,
                                                                 CONCAT15(in_stack_fffffffffffffde5,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                                               (char *)in_stack_fffffffffffffdd8);
                                    bVar12 = SimpleString::startsWith
                                                       ((SimpleString *)
                                                        CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3
                                                  ,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6,
                                                  CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                    SimpleString::~SimpleString((SimpleString *)0x123518);
                                    if (bVar12) {
                                      addExcludeStrictGroupFilter
                                                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c
                                                 ,in_stack_fffffffffffffe40,
                                                 in_stack_fffffffffffffe38);
                                    }
                                    else {
                                      SimpleString::SimpleString
                                                ((SimpleString *)
                                                 CONCAT17(in_stack_fffffffffffffde7,
                                                          CONCAT16(in_stack_fffffffffffffde6,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                                                 (char *)in_stack_fffffffffffffdd8);
                                      bVar12 = SimpleString::startsWith
                                                         ((SimpleString *)
                                                          CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(
                                                  bVar3,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6
                                                  ,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                      SimpleString::~SimpleString((SimpleString *)0x1235a6);
                                      if (bVar12) {
                                        addNameFilter(in_stack_fffffffffffffe50,
                                                      in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe40,
                                                      in_stack_fffffffffffffe38);
                                      }
                                      else {
                                        SimpleString::SimpleString
                                                  ((SimpleString *)
                                                   CONCAT17(in_stack_fffffffffffffde7,
                                                            CONCAT16(in_stack_fffffffffffffde6,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                                                  (char *)in_stack_fffffffffffffdd8);
                                        bVar12 = SimpleString::startsWith
                                                           ((SimpleString *)
                                                            CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(
                                                  bVar3,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6
                                                  ,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                        SimpleString::~SimpleString((SimpleString *)0x123634);
                                        if (bVar12) {
                                          addStrictNameFilter(in_stack_fffffffffffffe50,
                                                              in_stack_fffffffffffffe4c,
                                                              in_stack_fffffffffffffe40,
                                                              in_stack_fffffffffffffe38);
                                        }
                                        else {
                                          SimpleString::SimpleString
                                                    ((SimpleString *)
                                                     CONCAT17(in_stack_fffffffffffffde7,
                                                              CONCAT16(in_stack_fffffffffffffde6,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                                                  (char *)in_stack_fffffffffffffdd8);
                                          bVar12 = SimpleString::startsWith
                                                             ((SimpleString *)
                                                              CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15
                                                  (bVar3,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(
                                                  bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                          SimpleString::~SimpleString((SimpleString *)0x1236c2);
                                          if (bVar12) {
                                            addExcludeNameFilter
                                                      (in_stack_fffffffffffffe50,
                                                       in_stack_fffffffffffffe4c,
                                                       in_stack_fffffffffffffe40,
                                                       in_stack_fffffffffffffe38);
                                          }
                                          else {
                                            SimpleString::SimpleString
                                                      ((SimpleString *)
                                                       CONCAT17(in_stack_fffffffffffffde7,
                                                                CONCAT16(in_stack_fffffffffffffde6,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                                                  (char *)in_stack_fffffffffffffdd8);
                                            bVar12 = SimpleString::startsWith
                                                               ((SimpleString *)
                                                                CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                            SimpleString::~SimpleString((SimpleString *)0x123750);
                                            if (bVar12) {
                                              addExcludeStrictNameFilter
                                                        (in_stack_fffffffffffffe50,
                                                         in_stack_fffffffffffffe4c,
                                                         in_stack_fffffffffffffe40,
                                                         in_stack_fffffffffffffe38);
                                            }
                                            else {
                                              SimpleString::SimpleString
                                                        ((SimpleString *)
                                                         CONCAT17(in_stack_fffffffffffffde7,
                                                                  CONCAT16(in_stack_fffffffffffffde6
                                                                           ,CONCAT15(
                                                  in_stack_fffffffffffffde5,
                                                  CONCAT14(in_stack_fffffffffffffde4,
                                                           CONCAT13(in_stack_fffffffffffffde3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                                                  (char *)in_stack_fffffffffffffdd8);
                                              bVar12 = SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                              SimpleString::~SimpleString((SimpleString *)0x1237de);
                                              if (bVar12) {
                                                local_19 = setShuffle(in_stack_fffffffffffffe30,
                                                                      in_stack_fffffffffffffe2c,
                                                                      in_stack_fffffffffffffe20,
                                                                      in_stack_fffffffffffffe18);
                                              }
                                              else {
                                                SimpleString::SimpleString
                                                          ((SimpleString *)
                                                           CONCAT17(in_stack_fffffffffffffde7,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffffde6,
                                                  CONCAT15(in_stack_fffffffffffffde5,
                                                           CONCAT14(in_stack_fffffffffffffde4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                                  ,(char *)in_stack_fffffffffffffdd8);
                                                in_stack_fffffffffffffde7 =
                                                     SimpleString::startsWith
                                                               ((SimpleString *)
                                                                CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                                SimpleString::~SimpleString
                                                          ((SimpleString *)0x123874);
                                                if ((in_stack_fffffffffffffde7 & 1) == 0) {
                                                  SimpleString::SimpleString
                                                            ((SimpleString *)
                                                             CONCAT17(in_stack_fffffffffffffde7,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffffde6,
                                                  CONCAT15(in_stack_fffffffffffffde5,
                                                           CONCAT14(in_stack_fffffffffffffde4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                                  ,(char *)in_stack_fffffffffffffdd8);
                                                  in_stack_fffffffffffffde6 =
                                                       SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                                  SimpleString::~SimpleString
                                                            ((SimpleString *)0x1238fd);
                                                  if ((in_stack_fffffffffffffde6 & 1) == 0) {
                                                    SimpleString::SimpleString
                                                              ((SimpleString *)
                                                               CONCAT17(in_stack_fffffffffffffde7,
                                                                        CONCAT16(
                                                  in_stack_fffffffffffffde6,
                                                  CONCAT15(in_stack_fffffffffffffde5,
                                                           CONCAT14(in_stack_fffffffffffffde4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                                  ,(char *)in_stack_fffffffffffffdd8);
                                                  in_stack_fffffffffffffde5 =
                                                       SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                                  SimpleString::~SimpleString
                                                            ((SimpleString *)0x123986);
                                                  if ((in_stack_fffffffffffffde5 & 1) == 0) {
                                                    SimpleString::SimpleString
                                                              ((SimpleString *)
                                                               CONCAT17(in_stack_fffffffffffffde7,
                                                                        CONCAT16(
                                                  in_stack_fffffffffffffde6,
                                                  CONCAT15(in_stack_fffffffffffffde5,
                                                           CONCAT14(in_stack_fffffffffffffde4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                                  ,(char *)in_stack_fffffffffffffdd8);
                                                  in_stack_fffffffffffffde3 =
                                                       SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                                  SimpleString::~SimpleString
                                                            ((SimpleString *)0x123a19);
                                                  if ((in_stack_fffffffffffffde3 & 1) == 0) {
                                                    SimpleString::SimpleString
                                                              ((SimpleString *)
                                                               CONCAT17(in_stack_fffffffffffffde7,
                                                                        CONCAT16(
                                                  in_stack_fffffffffffffde6,
                                                  CONCAT15(in_stack_fffffffffffffde5,
                                                           CONCAT14(in_stack_fffffffffffffde4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                                                  ,(char *)in_stack_fffffffffffffdd8);
                                                  in_stack_fffffffffffffde1 =
                                                       SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(bVar10,CONCAT15(bVar11,
                                                  CONCAT14(in_stack_fffffffffffffdf4,
                                                           CONCAT13(in_stack_fffffffffffffdf3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))));
                                                  SimpleString::~SimpleString
                                                            ((SimpleString *)0x123ab7);
                                                  if ((in_stack_fffffffffffffde1 & 1) == 0) {
                                                    local_19 = false;
                                                  }
                                                  else {
                                                    setPackageName(in_stack_fffffffffffffe50,
                                                                   in_stack_fffffffffffffe4c,
                                                                   in_stack_fffffffffffffe40,
                                                                   in_stack_fffffffffffffe38);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffffde2 =
                                                         (**(code **)(*in_RSI + 0x38))
                                                                   (in_RSI,*(undefined4 *)
                                                                            (in_RDI + 8),
                                                                    *(undefined8 *)(in_RDI + 0x10),
                                                                    local_20);
                                                    local_19 = (bool)(in_stack_fffffffffffffde2 & 1)
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffffde4 =
                                                         setOutputType(in_stack_fffffffffffffe98,
                                                                       in_stack_fffffffffffffe94,
                                                                       in_stack_fffffffffffffe88,
                                                                       in_stack_fffffffffffffe80);
                                                    local_19 = (bool)in_stack_fffffffffffffde4;
                                                  }
                                                  }
                                                  else {
                                                    addTestToRunBasedOnVerboseOutput
                                                              (in_stack_fffffffffffffec0,
                                                               in_stack_fffffffffffffebc,
                                                               in_stack_fffffffffffffeb0,
                                                               in_stack_fffffffffffffea8,
                                                               in_stack_fffffffffffffea0);
                                                  }
                                                }
                                                else {
                                                  addTestToRunBasedOnVerboseOutput
                                                            (in_stack_fffffffffffffec0,
                                                             in_stack_fffffffffffffebc,
                                                             in_stack_fffffffffffffeb0,
                                                             in_stack_fffffffffffffea8,
                                                             in_stack_fffffffffffffea0);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  addStrictGroupFilter
                                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                                }
                              }
                              else {
                                in_stack_fffffffffffffdf1 =
                                     addGroupDotNameFilter
                                               (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                                                in_stack_fffffffffffffec8,
                                                (int *)in_stack_fffffffffffffec0);
                                local_19 = (bool)in_stack_fffffffffffffdf1;
                              }
                            }
                            else {
                              addGroupFilter(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                            }
                          }
                          else {
                            setRepeatCount(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                          }
                        }
                        else {
                          *(undefined1 *)(in_RDI + 0x22) = 1;
                        }
                      }
                      else {
                        *(undefined1 *)(in_RDI + 0x20) = 1;
                      }
                    }
                    else {
                      *(undefined1 *)(in_RDI + 0x1f) = 1;
                    }
                  }
                  else {
                    *(undefined1 *)(in_RDI + 0x1e) = 1;
                  }
                }
                else {
                  *(undefined1 *)(in_RDI + 0x1d) = 1;
                }
              }
              else {
                *(undefined1 *)(in_RDI + 0x21) = 1;
              }
            }
            else {
              *(undefined1 *)(in_RDI + 0x1c) = 1;
            }
          }
          else {
            *(undefined1 *)(in_RDI + 0x1b) = 1;
          }
        }
        else {
          *(undefined1 *)(in_RDI + 0x1a) = 1;
        }
      }
      else {
        *(undefined1 *)(in_RDI + 0x19) = 1;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0x18) = 1;
      local_19 = false;
    }
    if (local_19 == false) {
      local_1 = 0;
    }
    SimpleString::~SimpleString((SimpleString *)0x123b75);
    if (local_19 == false) goto LAB_00123bb0;
  }
  local_1 = 1;
LAB_00123bb0:
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if (argument == "-h") {
            needHelp_ = true;
            correctParameters = false;
        }
        else if (argument == "-v") verbose_ = true;
        else if (argument == "-vv") veryVerbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-b") reversing_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ll") listTestLocations_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument == "-f") crashOnFail_ = true;
        else if (argument.startsWith("-r")) setRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) addGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-t")) correctParameters = addGroupDotNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) addStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) addExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) addExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) addNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) addStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) addExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) addExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-s")) correctParameters = setShuffle(ac_, av_, i);
        else if (argument.startsWith("TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = setOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) setPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}